

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

parser_error parse_renderer_code(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *__s2;
  int iVar4;
  long lVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s2 = parser_getstr(p,"code");
    iVar4 = 1;
    lVar5 = 0;
    do {
      iVar1 = strcmp(*(char **)((long)backend_names + lVar5),__s2);
      if (iVar1 == 0) goto LAB_001e0000;
      iVar4 = iVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x50);
    iVar4 = 0;
LAB_001e0000:
    if (iVar4 == 0) {
      pVar2 = PARSE_ERROR_INVALID_VALUE;
    }
    else {
      *(long *)((long)pvVar3 + 0x30) = (long)iVar4 * 0x38 + 0x285748;
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_renderer_code(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *code;
	int ind;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	code = parser_getstr(p, "code");
	ind = lookup_backend_by_name(code);
	if (ind == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	renderer->backend = backends + ind - 1;
	return PARSE_ERROR_NONE;
}